

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O2

vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> * __thiscall
prometheus::Family<prometheus::Counter>::Collect
          (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
           *__return_storage_ptr__,Family<prometheus::Counter> *this)

{
  __node_base *p_Var1;
  initializer_list<prometheus::MetricFamily> __l;
  allocator_type local_121;
  undefined1 local_120 [32];
  _Alloc_hider local_100;
  size_type sStack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined8 local_e0;
  vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> local_d8;
  ClientMetric local_c0;
  
  std::mutex::lock(&this->mutex_);
  if ((this->metrics_)._M_h._M_element_count == 0) {
    (__return_storage_ptr__->
    super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_120._0_8_ = local_120 + 0x10;
    sStack_f8 = 0;
    local_f0._8_8_ = 0;
    local_120._16_8_ = 0;
    local_120._24_8_ = 0;
    local_120._8_8_ = 0;
    local_100._M_p = (pointer)&local_f0;
    local_f0._M_allocated_capacity = 0;
    local_e0._0_4_ = Untyped;
    local_e0._4_4_ = 0;
    local_d8.super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_assign((string *)local_120);
    std::__cxx11::string::_M_assign((string *)&local_100);
    local_e0 = (ulong)local_e0._4_4_ << 0x20;
    std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::reserve
              (&local_d8,(this->metrics_)._M_h._M_element_count);
    p_Var1 = &(this->metrics_)._M_h._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      CollectMetric(&local_c0,this,(Labels *)(p_Var1 + 1),(Counter *)p_Var1[7]._M_nxt);
      std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::
      emplace_back<prometheus::ClientMetric>(&local_d8,&local_c0);
      ClientMetric::~ClientMetric(&local_c0);
    }
    MetricFamily::MetricFamily((MetricFamily *)&local_c0,(MetricFamily *)local_120);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_c0;
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::vector
              (__return_storage_ptr__,__l,&local_121);
    MetricFamily::~MetricFamily((MetricFamily *)&local_c0);
    MetricFamily::~MetricFamily((MetricFamily *)local_120);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<MetricFamily> Family<T>::Collect() const {
  std::lock_guard<std::mutex> lock{mutex_};

  if (metrics_.empty()) {
    return {};
  }

  auto family = MetricFamily{};
  family.name = name_;
  family.help = help_;
  family.type = T::metric_type;
  family.metric.reserve(metrics_.size());
  for (const auto& m : metrics_) {
    family.metric.push_back(std::move(CollectMetric(m.first, m.second.get())));
  }
  return {family};
}